

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetZeroGuess(SUNLinearSolver S,int myid)

{
  uint uVar1;
  uint in_ESI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetZeroGuess(in_RDI,1);
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((in_ESI == 0) && (printf("    PASSED test -- SUNLinSolSetZeroGuess \n"), print_time != 0)) {
      printf("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",dVar3 - dVar2);
    }
    dVar2 = get_time();
    uVar1 = SUNLinSolSetZeroGuess(in_RDI,0);
    dVar3 = get_time();
    if (uVar1 == 0) {
      if ((in_ESI == 0) && (printf("    PASSED test -- SUNLinSolSetZeroGuess \n"), print_time != 0))
      {
        printf("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",dVar3 - dVar2);
      }
      local_4 = 0;
    }
    else {
      printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",(ulong)uVar1,
             (ulong)in_ESI);
      local_4 = 1;
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)in_ESI);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSetZeroGuess(SUNLinearSolver S, int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetZeroGuess routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetZeroGuess(S, SUNTRUE);
  stop_time  = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetZeroGuess \n");
    PRINT_TIME("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",
               stop_time - start_time);
  }

  /* try calling SetZeroGuess routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetZeroGuess(S, SUNFALSE);
  stop_time  = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetZeroGuess returned %d on Proc %d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetZeroGuess \n");
    PRINT_TIME("    SUNLinSolSetZeroGuess Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}